

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessageTest.cpp
# Opt level: O2

void __thiscall
AssertionMessageTest_formatInt_Test::TestBody(AssertionMessageTest_formatInt_Test *this)

{
  AssertionMessage *pAVar1;
  char *message;
  int16_t int16Value;
  AssertionMessage local_78;
  AssertHelper local_70;
  int32_t int32Value;
  AssertionResult gtest_ar;
  string local_50;
  int64_t int64Value;
  string expectedMessage;
  
  std::__cxx11::string::string
            ((string *)&expectedMessage,"32767 2147483647 9223372036854775807",
             (allocator *)&local_50);
  int16Value = 0x7fff;
  int32Value = 0x7fffffff;
  int64Value = 0x7fffffffffffffff;
  cppassert::internal::AssertionMessage::AssertionMessage(&local_78);
  pAVar1 = cppassert::internal::AssertionMessage::operator<<(&local_78,&int16Value);
  pAVar1 = cppassert::internal::AssertionMessage::operator<<(pAVar1,(char (*) [2])0x160eee);
  pAVar1 = cppassert::internal::AssertionMessage::operator<<(pAVar1,&int32Value);
  pAVar1 = cppassert::internal::AssertionMessage::operator<<(pAVar1,(char (*) [2])0x160eee);
  cppassert::internal::AssertionMessage::operator<<(pAVar1,&int64Value);
  cppassert::internal::AssertionMessage::str_abi_cxx11_(&local_50,&local_78);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"expectedMessage","message.str()",&expectedMessage,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionMessageTest.cpp"
               ,0x34,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (local_78.stream_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_78.stream_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&expectedMessage);
  return;
}

Assistant:

TEST(AssertionMessageTest, formatInt)
{
    const std::string expectedMessage("32767 2147483647 9223372036854775807");

    std::int16_t int16Value = 32767;
    std::int32_t int32Value = 2147483647;
    std::int64_t int64Value = 9223372036854775807;

    cppassert::internal::AssertionMessage message;
    message<<int16Value<<" "<<int32Value<<" "<<int64Value;
    EXPECT_EQ(expectedMessage, message.str());
}